

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::SharedDtor(CodeGeneratorResponse_File *this)

{
  GeneratedCodeInfo *this_00;
  Arena *pAVar1;
  LogMessage *other;
  string *psVar2;
  CodeGeneratorResponse_File *pCVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  CodeGeneratorResponse_File *local_10;
  CodeGeneratorResponse_File *this_local;
  
  local_10 = this;
  pAVar1 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x3da);
    local_49 = 1;
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->name_,psVar2);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->insertion_point_,psVar2);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->content_,psVar2);
  pCVar3 = internal_default_instance();
  if ((this != pCVar3) &&
     (this_00 = this->generated_code_info_, this_00 != (GeneratedCodeInfo *)0x0)) {
    GeneratedCodeInfo::~GeneratedCodeInfo(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

inline void CodeGeneratorResponse_File::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  insertion_point_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  content_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete generated_code_info_;
}